

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_append_index
          (CompilerGLSL *this,string *expr,uint32_t param_2,SPIRType *param_3,AccessChainFlags flags
          ,bool *access_chain_is_arrayed,uint32_t index)

{
  ulong uVar1;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string expr_back;
  undefined1 local_90 [8];
  string expr_front;
  size_t enclose_split;
  size_t split_pos;
  string idx_expr;
  bool register_expression_read;
  bool ptr_chain;
  bool index_is_literal;
  bool *access_chain_is_arrayed_local;
  AccessChainFlags flags_local;
  SPIRType *param_3_local;
  uint32_t param_2_local;
  string *expr_local;
  CompilerGLSL *this_local;
  
  idx_expr.field_2._M_local_buf[0xf] = (flags & 1) != 0;
  idx_expr.field_2._M_local_buf[0xe] = (flags & 4) != 0;
  idx_expr.field_2._M_local_buf[0xd] = (flags & 8) == 0;
  if ((bool)idx_expr.field_2._M_local_buf[0xf]) {
    convert_to_string<unsigned_int,_0>((string *)&split_pos,&index);
  }
  else {
    to_unpacked_expression_abi_cxx11_
              ((string *)&split_pos,this,index,(bool)idx_expr.field_2._M_local_buf[0xd]);
  }
  if (((idx_expr.field_2._M_local_buf[0xe] & 1U) != 0) && ((*access_chain_is_arrayed & 1U) != 0)) {
    uVar1 = ::std::__cxx11::string::find_last_of((char)expr,0x5d);
    expr_front.field_2._8_8_ = ::std::__cxx11::string::find_last_of((char)expr,0x29);
    if (((ulong)expr_front.field_2._8_8_ < uVar1) ||
       (expr_front.field_2._8_8_ == 0xffffffffffffffff)) {
      ::std::__cxx11::string::substr((ulong)local_90,(ulong)expr);
      ::std::__cxx11::string::substr((ulong)local_c0,(ulong)expr);
      ::std::operator+(&local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ," + ");
      enclose_expression(&local_140,this,(string *)&split_pos);
      ::std::operator+(&local_100,&local_120,&local_140);
      ::std::operator+(&local_e0,&local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
      ::std::__cxx11::string::operator=((string *)expr,(string *)&local_e0);
      ::std::__cxx11::string::~string((string *)&local_e0);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_120);
      ::std::__cxx11::string::~string((string *)local_c0);
      ::std::__cxx11::string::~string((string *)local_90);
      goto LAB_003b7b22;
    }
  }
  ::std::__cxx11::string::operator+=((string *)expr,"[");
  ::std::__cxx11::string::operator+=((string *)expr,(string *)&split_pos);
  ::std::__cxx11::string::operator+=((string *)expr,"]");
LAB_003b7b22:
  ::std::__cxx11::string::~string((string *)&split_pos);
  return;
}

Assistant:

void CompilerGLSL::access_chain_internal_append_index(std::string &expr, uint32_t /*base*/, const SPIRType * /*type*/,
                                                      AccessChainFlags flags, bool &access_chain_is_arrayed,
                                                      uint32_t index)
{
	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;

	string idx_expr = index_is_literal ? convert_to_string(index) : to_unpacked_expression(index, register_expression_read);

	// For the case where the base of an OpPtrAccessChain already ends in [n],
	// we need to use the index as an offset to the existing index, otherwise,
	// we can just use the index directly.
	if (ptr_chain && access_chain_is_arrayed)
	{
		size_t split_pos = expr.find_last_of(']');
		size_t enclose_split = expr.find_last_of(')');

		// If we have already enclosed the expression, don't try to be clever, it will break.
		if (split_pos > enclose_split || enclose_split == string::npos)
		{
			string expr_front = expr.substr(0, split_pos);
			string expr_back = expr.substr(split_pos);
			expr = expr_front + " + " + enclose_expression(idx_expr) + expr_back;
			return;
		}
	}

	expr += "[";
	expr += idx_expr;
	expr += "]";
}